

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O1

void nn_fsm_swap_owner(nn_fsm *self,nn_fsm_owner *owner)

{
  int iVar1;
  nn_fsm *pnVar2;
  
  iVar1 = self->src;
  pnVar2 = self->owner;
  self->src = owner->src;
  self->owner = owner->fsm;
  owner->src = iVar1;
  owner->fsm = pnVar2;
  return;
}

Assistant:

void nn_fsm_swap_owner (struct nn_fsm *self, struct nn_fsm_owner *owner)
{
    int oldsrc;
    struct nn_fsm *oldowner;

    oldsrc = self->src;
    oldowner = self->owner;
    self->src = owner->src;
    self->owner = owner->fsm;
    owner->src = oldsrc;
    owner->fsm = oldowner;
}